

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O3

void __thiscall
stateObservation::LipmDcmEstimator::setInputs
          (LipmDcmEstimator *this,Vector2 *dcm,Vector2 *zmp,Matrix2 *orientation,
          Vector2 *CoMOffset_gamma,double ZMPCoef_kappa)

{
  LinearKalmanFilter *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  DstEvaluatorType dstEvaluator;
  TimeSize TVar10;
  Vector2 *pVVar11;
  double *pdVar12;
  undefined8 *puVar13;
  SrcEvaluatorType srcEvaluator_3;
  SrcEvaluatorType srcEvaluator_2;
  SrcEvaluatorType srcEvaluator_1;
  Vector4 u;
  MeasureVector local_88;
  long local_78;
  long local_70;
  double local_68;
  double dStack_60;
  Vector2 local_58;
  double local_48;
  double dStack_40;
  
  dVar1 = (CoMOffset_gamma->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
          m_data.array[0];
  if ((dVar1 != (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                m_storage.m_data.array[0]) ||
     (NAN(dVar1) ||
      NAN((this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
          m_data.array[0]))) {
LAB_0017eba6:
    dVar1 = (CoMOffset_gamma->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
            m_storage.m_data.array[1];
    (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
    array[0] = (CoMOffset_gamma->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
               m_storage.m_data.array[0];
    (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
    array[1] = dVar1;
    this->needUpdateMatrices_ = true;
  }
  else {
    dVar1 = (CoMOffset_gamma->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
            m_storage.m_data.array[1];
    pdVar12 = (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
              m_data.array + 1;
    if ((dVar1 != *pdVar12) || (NAN(dVar1) || NAN(*pdVar12))) goto LAB_0017eba6;
  }
  if ((this->kappa_ != ZMPCoef_kappa) || (NAN(this->kappa_) || NAN(ZMPCoef_kappa))) {
    this->kappa_ = ZMPCoef_kappa;
    this->needUpdateMatrices_ = true;
  }
  this_00 = &this->filter_;
  bVar9 = ZeroDelayObserver::stateIsSet((ZeroDelayObserver *)this_00);
  if (!bVar9) {
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x3f847ae147ae147b;
    local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         0x3f847ae147ae147b;
    resetWithMeasurements(this,dcm,zmp,orientation,true,&local_58,(Vector2 *)&local_88);
    return;
  }
  TVar10 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)this_00);
  if (1 < TVar10) {
    update(this);
  }
  local_68 = (dcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
             array[0];
  dStack_60 = (dcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[1];
  local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&local_58;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_78 = 1;
  local_70 = 2;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0];
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_88,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&this->gamma_);
  if ((local_70 +
       local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 4
      ) || (local_78 != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
                 );
  }
  dVar1 = (zmp->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[0] = (zmp->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[0];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[1] = dVar1;
  pVVar11 = (Vector2 *)malloc(0x10);
  if (((ulong)pVVar11 & 0xf) != 0) {
LAB_0017edbb:
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (pVVar11 != (Vector2 *)0x0) {
    local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
    (pVVar11->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
    [0] = local_68;
    (pVVar11->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
    [1] = dStack_60;
    local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)pVVar11;
    ZeroDelayObserver::pushMeasurement((ZeroDelayObserver *)this_00,&local_88);
    free(local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pdVar12 = (double *)malloc(0x20);
    if (((ulong)pdVar12 & 0xf) != 0) goto LAB_0017edbb;
    if (pdVar12 != (double *)0x0) {
      local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 4;
      *pdVar12 = local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                 m_data.array[0];
      pdVar12[1] = local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                   m_data.array[1];
      pdVar12[2] = local_48;
      pdVar12[3] = dStack_40;
      local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar12;
      ZeroDelayObserver::pushInput((ZeroDelayObserver *)this_00,&local_88);
      free(local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      dVar1 = (this->previousOrientation_).
              super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0]
      ;
      dVar2 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
              m_data.array[0];
      dVar3 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
              m_data.array[1];
      dVar4 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
              m_data.array[2];
      dVar5 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
              m_data.array[3];
      dVar6 = (this->previousOrientation_).
              super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
      ;
      dVar7 = (this->previousOrientation_).
              super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
      ;
      dVar8 = (this->previousOrientation_).
              super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1]
      ;
      (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = dVar6 * dVar4 + dVar1 * dVar2;
      (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = dVar6 * dVar5 + dVar1 * dVar3;
      (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = dVar7 * dVar4 + dVar8 * dVar2;
      (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = dVar7 * dVar5 + dVar8 * dVar3;
      dVar1 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
              m_data.array[1];
      (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
      m_storage.m_data.array[0] =
           (orientation->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
           m_data.array[0];
      (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
      m_storage.m_data.array[1] = dVar1;
      dVar1 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
              m_data.array[3];
      (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
      m_storage.m_data.array[2] =
           (orientation->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
           m_data.array[2];
      (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
      m_storage.m_data.array[3] = dVar1;
      return;
    }
  }
  puVar13 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar13 = operator_delete;
  __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void LipmDcmEstimator::setInputs(const Vector2 & dcm,
                                 const Vector2 & zmp,
                                 const Matrix2 & orientation,
                                 const Vector2 & CoMOffset_gamma,
                                 const double ZMPCoef_kappa)
{
  setUnbiasedCoMOffset(CoMOffset_gamma);
  setZMPCoef(ZMPCoef_kappa);
  if(filter_.stateIsSet())
  {
    if(filter_.getMeasurementsNumber() > 1)
    {
      update(); /// update the estimation of the state to synchronize with the measurements
    }

    Vector4 u;
    Vector2 y;

    y = dcm;

    /// The prediction of the state depends on the previous value of the ZMP
    u << previousZmp_, gamma_;
    previousZmp_ = zmp;

    filter_.pushMeasurement(y);
    filter_.pushInput(u);

    A_.bottomRightCorner<2, 2>() = orientation * previousOrientation_.transpose(); /// set the rotation difference
    previousOrientation_ = orientation;
  }
  else
  {
    resetWithMeasurements(dcm, zmp, orientation, true);
  }
}